

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_controller.cpp
# Opt level: O3

void __thiscall
ConfidentialTransactionController_GetVsizeIgnoreTxIn_Test::TestBody
          (ConfidentialTransactionController_GetVsizeIgnoreTxIn_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  ConfidentialTransactionController blind_tx;
  ConfidentialTransactionController expect_tx;
  Message local_e0;
  AssertHelper local_d8;
  string local_d0;
  ConfidentialTransactionController local_b0;
  ConfidentialTransactionController local_60;
  
  local_b0.super_AbstractTransactionController._vptr_AbstractTransactionController =
       (_func_int **)&local_b0.transaction_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,
             "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000080171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000100000002540be40001000000003b9aca00040135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000107ec1ec7027d89071814d5ccd1f5ea4cee45e598287fc8f59acbb1d9129081dc0100000002540be400001976a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac01aaf1579c847497d406605b4ef875a2b37164f4c5b9e5d2a23b2b2a16e132ec0501000000003b9aca00001976a914ae8cab151547d6f6e25b62b41200368dfdabe62b88ac0000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb539077000000000000000000"
             ,"");
  cfd::ConfidentialTransactionController::ConfidentialTransactionController
            (&local_60,(string *)&local_b0);
  if ((ConfidentialTransaction *)
      local_b0.super_AbstractTransactionController._vptr_AbstractTransactionController !=
      &local_b0.transaction_) {
    operator_delete(local_b0.super_AbstractTransactionController._vptr_AbstractTransactionController
                   );
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,
             "02000000010117c10bbfcd4e89f6c33864ed627aa113f249343f4b2bbe6e86dcc725e0d06cfc010000006a473044022038527c96efaaa29b862c8fe8aa4e96602b03035505ebe1f166dd8b9f3731b7b502207e75d937ca1bb2e2f4208618051eb8aad02ad88a71477d7a6e7ec257f72cb6500121036b70f6598ee5c00ad068c9b86c7a1d5c433767a46db3bc3f9d53417171db1782fdffffff030bc7b2b8da0c30f37b12580e0bd092bfbe16e28494fe30feab1769ab4135d30a7609c8e4c3012d90840dbed48eeebc253399645119c01125488640f415285e6e7663031651fe4267cf54e606a83e4c741a01df124d4eb915ae37ad9d5191661d74310b1976a91479975e7d3775b748cbcd5500804518280a2ebbae88ac0b8f78a97d70ad5799c1ef2ca5f7f553ec30fdc87392eb2b5a9acc42d72f5900250978d7a93a301c65b0759c8e7f4b4424ff2a4c124ee2467b08e266423faa3afef30249a8537d641e728c2192f66433e125041341b36fa3e3cde5578ad1acb9a3944b17a9141cd92b989652fbc4c2a92eb1d56456d0ef17d4158701bdc7073c43d37ace6b66b02268ece4754fe6c39a985a16ccbe6cf05b89014d7201000000000000971800000a0000000000000043010001cd72e3aa85cc53ce42edd91e03a6b4d3cd6b08d2125f019639f0ae6ee29e7f8539232c60e68020ab948d95e5c70da679309e8a511a1a0ef65c7b5e5f4dfb83c7fd4d0b60230000000000000001c39d00a796090bd9872e87a9d5f06b5c73c4fe64104a59c25536f90813b311c90de520f63a57875a2e9b6111f41f5fb7b4a253c76027af35fbcf7ddb9e5688ebefb04948f349e48e2ef4cd73b17f1d5786822222f2a1e5367bd1d39b139283800bfc4b7d50ce927469541151be53b3518b0fa1e9acb8089072976b1d659e8136c666f0b57cec51775ccd40998ee57ace137e25ee7e066d9d434c0e54304913019db87855de47f7f1e974578dfedb95a92048fafe0dca541bd917ea22d9c02fd58fafc8ee35f016b4b1ebf0051a314038201163b3fc6fa09b7ac0bf45474b216f8e152433433193b6e5db6da465ddd5c0e7d23b6a2e153998e0e936539aa3ce4f1ed448157dff1f420c404c019ec5e86ab18a9b859cc3165a7f104f3a7a9abb6835a62834750f110730e7d16de16cbb7f6607fc4ae04de5baec980e3137766c23568f8bb03473d3e043d3a8d8da0a2613bf27d0ce388ed44b8e1a217b2ef5193d19fb6b943c1b8a1bebfb02b9cea87fec0edbe03ee63a3a1168c53456af1fed9fe7707b2fb58159922cb84e1e28a29d26e036c12c91666096d556eefada060c530a28837f37a456847a26fcee92092837c14144ac3e1f3a84763e40cced0d77dcfe76f537825e08d2441d612d5e80eef617ffa6b96e30825d8905bef96dd4da8457f8d43e3f3c029444..." /* TRUNCATED STRING LITERAL */
             ,"");
  cfd::ConfidentialTransactionController::ConfidentialTransactionController(&local_b0,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  local_e0.ss_.ptr_._0_4_ =
       cfd::ConfidentialTransactionController::GetSizeIgnoreTxIn
                 (&local_60,false,(uint32_t *)0x0,(uint32_t *)0x0,0,0x34);
  local_d8.data_._0_4_ = 0x10c;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_d0,"expect_tx.GetSizeIgnoreTxIn()","268",(uint *)&local_e0,
             (int *)&local_d8);
  if ((char)local_d0._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_e0);
    if ((undefined8 *)local_d0._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_d0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0x68,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (CONCAT44(local_e0.ss_.ptr_._4_4_,(uint32_t)local_e0.ss_.ptr_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_e0.ss_.ptr_._4_4_,(uint32_t)local_e0.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_e0.ss_.ptr_._4_4_,(uint32_t)local_e0.ss_.ptr_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_d0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_e0.ss_.ptr_._0_4_ =
       cfd::ConfidentialTransactionController::GetVsizeIgnoreTxIn(&local_60,false,0,0x34);
  local_d8.data_._0_4_ = 0x106;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_d0,"expect_tx.GetVsizeIgnoreTxIn()","262",(uint *)&local_e0,
             (int *)&local_d8);
  if ((char)local_d0._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_e0);
    if ((undefined8 *)local_d0._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_d0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0x69,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (CONCAT44(local_e0.ss_.ptr_._4_4_,(uint32_t)local_e0.ss_.ptr_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_e0.ss_.ptr_._4_4_,(uint32_t)local_e0.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_e0.ss_.ptr_._4_4_,(uint32_t)local_e0.ss_.ptr_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_d0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_e0.ss_.ptr_._0_4_ =
       cfd::ConfidentialTransactionController::GetSizeIgnoreTxIn
                 (&local_b0,false,(uint32_t *)0x0,(uint32_t *)0x0,0,0x34);
  local_d8.data_._0_4_ = 0x185b;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_d0,"blind_tx.GetSizeIgnoreTxIn()","6235",(uint *)&local_e0,
             (int *)&local_d8);
  if ((char)local_d0._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_e0);
    if ((undefined8 *)local_d0._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_d0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0x6b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (CONCAT44(local_e0.ss_.ptr_._4_4_,(uint32_t)local_e0.ss_.ptr_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_e0.ss_.ptr_._4_4_,(uint32_t)local_e0.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_e0.ss_.ptr_._4_4_,(uint32_t)local_e0.ss_.ptr_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_d0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_e0.ss_.ptr_._0_4_ =
       cfd::ConfidentialTransactionController::GetVsizeIgnoreTxIn(&local_b0,false,0,0x34);
  local_d8.data_._0_4_ = 0x6fa;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_d0,"blind_tx.GetVsizeIgnoreTxIn()","1786",(uint *)&local_e0,
             (int *)&local_d8);
  if ((char)local_d0._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_e0);
    if ((undefined8 *)local_d0._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_d0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0x6c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (CONCAT44(local_e0.ss_.ptr_._4_4_,(uint32_t)local_e0.ss_.ptr_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_e0.ss_.ptr_._4_4_,(uint32_t)local_e0.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_e0.ss_.ptr_._4_4_,(uint32_t)local_e0.ss_.ptr_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_d0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_b0.super_AbstractTransactionController._vptr_AbstractTransactionController =
       (_func_int **)&PTR__ConfidentialTransactionController_007233d8;
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&local_b0.transaction_);
  local_60.super_AbstractTransactionController._vptr_AbstractTransactionController =
       (_func_int **)&PTR__ConfidentialTransactionController_007233d8;
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&local_60.transaction_);
  return;
}

Assistant:

TEST(ConfidentialTransactionController, AddPegoutTxOut)
{
    ConfidentialTransactionController txc(2, 0);
    Address addr;
    txc.AddTxIn(Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"), 0, 4294967293);
    txc.AddTxOut(
        Address("XBMr6srTXmWuHifFd8gs54xYfiCBsvrksA", cfd::core::GetElementsAddressFormatList()),
        Amount::CreateBySatoshiAmount(209998999992700),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));
    txc.AddPegoutTxOut(
        Amount::CreateBySatoshiAmount(1000000000),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"),
        BlockHash("0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"),
        Address("2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo"),
        NetType::kRegtest,
        Pubkey("0214156e4ae9168289b4d0c034da94025121d33ad8643663454885032d77640e3d"),
        Privkey::FromWif("cVPA9nh4bHhKXinBCLkJJTD3UgfiizWRykXfFegwZzKMNYAKG9RL", NetType::kRegtest),
        "sh(wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y/0/*))",
        0,
        ByteData("030e07d4f657c0c169e04fac5d5a8096adb099874834be59ad1e681e22d952ccda0214156e4ae9168289b4d0c034da94025121d33ad8643663454885032d77640e3d"),
        NetType::kElementsRegtest,
        &addr);
    txc.AddTxOutFee(
        Amount::CreateBySatoshiAmount(7300),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));

    EXPECT_STREQ(txc.GetHex().c_str(), "020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00009e6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da872103700dcb030588ed828d85f645b48971de0d31e8c0244da46710d18681627f5a4a4101044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d00660125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000");
    EXPECT_STREQ(addr.GetAddress().c_str(), "2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo");
}